

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

bool __thiscall
cmGeneratorTarget::MaybeHaveInterfaceProperty
          (cmGeneratorTarget *this,string *prop,cmGeneratorExpressionContext *context,
          LinkInterfaceFor interfaceFor)

{
  bool bVar1;
  bool *pbVar2;
  cmValue val;
  cmLinkInterfaceLibraries *this_00;
  reference pcVar3;
  pointer ppVar4;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>,_bool>
  pVar5;
  cmGeneratorTarget *local_130;
  cmLinkItem *lib;
  const_iterator __end5;
  const_iterator __begin5;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range5;
  cmLinkInterfaceLibraries *iface;
  cmGeneratorTarget *headTarget;
  bool *maybeInterfaceProp;
  bool local_99;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_98;
  undefined1 local_90;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_88;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
  local_80;
  iterator i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string key;
  LinkInterfaceFor interfaceFor_local;
  cmGeneratorExpressionContext *context_local;
  string *prop_local;
  cmGeneratorTarget *this_local;
  
  key.field_2._12_4_ = interfaceFor;
  std::operator+(&local_68,prop,'@');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,&context->Config);
  std::__cxx11::string::~string((string *)&local_68);
  local_80._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       ::find(&this->MaybeInterfacePropertyExists,(key_type *)local_48);
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
       ::end(&this->MaybeInterfacePropertyExists);
  bVar1 = std::__detail::operator==(&local_80,&local_88);
  if (bVar1) {
    local_99 = false;
    pVar5 = std::
            unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
            ::emplace<std::__cxx11::string_const&,bool>
                      ((unordered_map<std::__cxx11::string,bool,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bool>>>
                        *)&this->MaybeInterfacePropertyExists,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                       ,&local_99);
    local_98._M_cur =
         (__node_type *)
         pVar5.first.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_true>
         ._M_cur;
    local_90 = pVar5.second;
    local_80._M_cur = local_98._M_cur;
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
                           *)&local_80);
    pbVar2 = &ppVar4->second;
    val = GetProperty(this,prop);
    bVar1 = cmNonempty(val);
    *pbVar2 = bVar1;
    if ((*pbVar2 & 1U) == 0) {
      local_130 = this;
      if (context->HeadTarget != (cmGeneratorTarget *)0x0) {
        local_130 = context->HeadTarget;
      }
      this_00 = GetLinkInterfaceLibraries(this,&context->Config,local_130,key.field_2._12_4_);
      if (this_00 != (cmLinkInterfaceLibraries *)0x0) {
        if ((this_00->HadHeadSensitiveCondition & 1U) == 0) {
          __end5 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(&this_00->Libraries);
          lib = (cmLinkItem *)
                std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(&this_00->Libraries);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end5,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                             *)&lib), bVar1) {
            pcVar3 = __gnu_cxx::
                     __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                     ::operator*(&__end5);
            if ((pcVar3->Target != (cmGeneratorTarget *)0x0) &&
               (bVar1 = MaybeHaveInterfaceProperty(pcVar3->Target,prop,context,key.field_2._12_4_),
               bVar1)) {
              *pbVar2 = true;
              break;
            }
            __gnu_cxx::
            __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
            ::operator++(&__end5);
          }
        }
        else {
          *pbVar2 = true;
        }
      }
    }
  }
  ppVar4 = std::__detail::
           _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
           ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_false,_true>
                         *)&local_80);
  bVar1 = ppVar4->second;
  std::__cxx11::string::~string((string *)local_48);
  return (bool)(bVar1 & 1);
}

Assistant:

bool cmGeneratorTarget::MaybeHaveInterfaceProperty(
  std::string const& prop, cmGeneratorExpressionContext* context,
  LinkInterfaceFor interfaceFor) const
{
  std::string const key = prop + '@' + context->Config;
  auto i = this->MaybeInterfacePropertyExists.find(key);
  if (i == this->MaybeInterfacePropertyExists.end()) {
    // Insert an entry now in case there is a cycle.
    i = this->MaybeInterfacePropertyExists.emplace(key, false).first;
    bool& maybeInterfaceProp = i->second;

    // If this target itself has a non-empty property value, we are done.
    maybeInterfaceProp = cmNonempty(this->GetProperty(prop));

    // Otherwise, recurse to interface dependencies.
    if (!maybeInterfaceProp) {
      cmGeneratorTarget const* headTarget =
        context->HeadTarget ? context->HeadTarget : this;
      if (cmLinkInterfaceLibraries const* iface =
            this->GetLinkInterfaceLibraries(context->Config, headTarget,
                                            interfaceFor)) {
        if (iface->HadHeadSensitiveCondition) {
          // With a different head target we may get to a library with
          // this interface property.
          maybeInterfaceProp = true;
        } else {
          // The transitive interface libraries do not depend on the
          // head target, so we can follow them.
          for (cmLinkItem const& lib : iface->Libraries) {
            if (lib.Target &&
                lib.Target->MaybeHaveInterfaceProperty(prop, context,
                                                       interfaceFor)) {
              maybeInterfaceProp = true;
              break;
            }
          }
        }
      }
    }
  }
  return i->second;
}